

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftraster.c
# Opt level: O2

void Horizontal_Sweep_Span
               (black_PWorker worker,Short y,FT_F26Dot6 x1,FT_F26Dot6 x2,PProfile_conflict left,
               PProfile_conflict right)

{
  ulong uVar1;
  ulong uVar2;
  
  uVar2 = -(long)worker->precision;
  if (((((x1 + worker->precision) - 1U & uVar2) == x1) &&
      (uVar1 = x1 >> ((byte)worker->precision_bits & 0x3f), -1 < (long)uVar1)) &&
     (uVar1 < (worker->target).rows)) {
    worker->bOrigin[(long)(short)((uint)(int)y >> 3) - uVar1 * (long)(worker->target).pitch] =
         worker->bOrigin[(long)(short)((uint)(int)y >> 3) - uVar1 * (long)(worker->target).pitch] |
         (byte)(0x80 >> ((byte)y & 7));
    uVar2 = -(long)worker->precision;
  }
  if ((((x2 & ~uVar2) == 0) &&
      (uVar2 = x2 >> ((byte)worker->precision_bits & 0x3f), -1 < (long)uVar2)) &&
     (uVar2 < (worker->target).rows)) {
    worker->bOrigin[(long)(short)((uint)(int)y >> 3) - uVar2 * (long)(worker->target).pitch] =
         worker->bOrigin[(long)(short)((uint)(int)y >> 3) - uVar2 * (long)(worker->target).pitch] |
         (byte)(0x80 >> ((byte)y & 7));
  }
  return;
}

Assistant:

static void
  Horizontal_Sweep_Span( RAS_ARGS Short       y,
                                  FT_F26Dot6  x1,
                                  FT_F26Dot6  x2,
                                  PProfile    left,
                                  PProfile    right )
  {
    Long  e1, e2;

    FT_UNUSED( left );
    FT_UNUSED( right );


    FT_TRACE7(( "  x=%d y=[% .12f;% .12f]",
                y,
                (double)x1 / (double)ras.precision,
                (double)x2 / (double)ras.precision ));

    /* We should not need this procedure but the vertical sweep   */
    /* mishandles horizontal lines through pixel centers.  So we  */
    /* have to check perfectly aligned span edges here.           */
    /*                                                            */
    /* XXX: Can we handle horizontal lines better and drop this?  */

    e1 = CEILING( x1 );

    if ( x1 == e1 )
    {
      e1 = TRUNC( e1 );

      if ( e1 >= 0 && (ULong)e1 < ras.target.rows )
      {
        Byte   f1;
        PByte  bits;


        bits = ras.bOrigin + ( y >> 3 ) - e1 * ras.target.pitch;
        f1   = (Byte)( 0x80 >> ( y & 7 ) );

        FT_TRACE7(( bits[0] & f1 ? " redundant"
                                 : " -> y=%ld edge", e1 ));

        bits[0] |= f1;
      }
    }

    e2 = FLOOR  ( x2 );

    if ( x2 == e2 )
    {
      e2 = TRUNC( e2 );

      if ( e2 >= 0 && (ULong)e2 < ras.target.rows )
      {
        Byte   f1;
        PByte  bits;


        bits = ras.bOrigin + ( y >> 3 ) - e2 * ras.target.pitch;
        f1   = (Byte)( 0x80 >> ( y & 7 ) );

        FT_TRACE7(( bits[0] & f1 ? " redundant"
                                 : " -> y=%ld edge", e2 ));

        bits[0] |= f1;
      }
    }

    FT_TRACE7(( "\n" ));
  }